

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::writeUint32High16(deUint8 *dst,deUint16 val)

{
  deUint32 uint32ByteOffset16To32;
  deUint16 val_local;
  deUint8 *dst_local;
  
  *(deUint16 *)(dst + 2) = val;
  return;
}

Assistant:

inline void writeUint32High16 (deUint8* dst, deUint16 val)
{
#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	const deUint32 uint32ByteOffset16To32	= 2;
#else
	const deUint32 uint32ByteOffset16To32	= 0;
#endif

	*(deUint16*)(dst + uint32ByteOffset16To32) = val;
}